

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<double,float>
          (internal *this,char *expected_expression,char *actual_expression,double *expected,
          float *actual)

{
  String *extraout_RDX;
  AssertionResult AVar2;
  String local_50;
  String local_40;
  double *local_30;
  float *actual_local;
  double *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<testing::internal::String> sVar1;
  
  local_30 = (double *)actual;
  actual_local = (float *)expected;
  expected_local = (double *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  if ((*expected != (double)*actual) || (NAN(*expected) || NAN((double)*actual))) {
    FormatForComparisonFailureMessage<double,float>((double *)&local_40,(float *)expected);
    FormatForComparisonFailureMessage<float,double>((float *)&local_50,local_30);
    EqFailure(this,expected_expression,actual_expression,&local_40,&local_50,false);
    String::~String(&local_50);
    String::~String(&local_40);
    sVar1.ptr_ = extraout_RDX;
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
#pragma warning(push)          // Saves the current warning state.
#pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
#pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}